

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Xdl.cpp
# Opt level: O2

void __thiscall asl::XdlEncoder::_encode(XdlEncoder *this,Var *v)

{
  String *pSVar1;
  bool bVar2;
  uint uVar3;
  Type TVar4;
  int iVar5;
  Var *pVVar6;
  char *_class;
  Var *pVVar7;
  int iVar8;
  int i;
  uint i_00;
  anon_union_8_8_7df20137_for_Var_3 x;
  String *b;
  uint i_01;
  uint uVar9;
  undefined1 local_78 [24];
  int local_60;
  int local_58;
  String *local_50;
  String local_48;
  
  switch(v->_type) {
  case NONE:
  case NUL:
    String::operator+=(&this->_out,"null");
    break;
  case NUMBER:
    new_number(this,(v->field_1)._d);
    break;
  case BOOL:
    new_bool(this,(v->field_1)._b);
    break;
  case INT:
    new_number(this,(v->field_1)._i);
    break;
  case SSTRING:
    x._l = (Long)&v->field_1;
    goto LAB_0012f167;
  case FLOAT:
    new_number(this,(float)(v->field_1)._d);
    break;
  case STRING:
    x = v->field_1;
LAB_0012f167:
    new_string(this,(char *)x);
    break;
  case ARRAY:
    begin_array(this);
    uVar3 = Var::length(v);
    pVVar6 = v;
    if (0 < (int)uVar3) {
      pVVar6 = Var::operator[](v,0);
    }
    i_00 = 0;
    iVar8 = 0;
    uVar9 = 0;
    if (this->_pretty == true) {
      if (uVar3 - 0xb < 0xfffffff6) {
        local_50 = (String *)(ulong)uVar3;
        if ((int)uVar3 < 0xb) {
          TVar4 = pVVar6->_type;
LAB_0012f279:
          iVar8 = 0;
          if ((TVar4 != STRING) && (uVar9 = 0, TVar4 != SSTRING)) goto LAB_0012f510;
          uVar9 = 0;
          if (0 < (int)uVar3) {
            uVar9 = uVar3;
          }
          i_01 = 0;
          local_50 = (String *)(ulong)uVar3;
          do {
            if (uVar9 == i_01) {
              iVar8 = 0;
              uVar9 = 0;
              goto LAB_0012f510;
            }
            pVVar7 = Var::operator[](v,i_01);
            iVar5 = Var::length(pVVar7);
            iVar8 = iVar8 + iVar5;
            i_01 = i_01 + 1;
          } while (iVar8 < 0x65);
        }
        if (((int)local_50 < 1) || (DIC < pVVar6->_type)) {
          uVar9 = 0;
        }
        else {
          uVar9 = 0x720 >> ((byte)pVVar6->_type & 0x1f);
        }
      }
      else {
        TVar4 = pVVar6->_type;
        uVar9 = 1;
        if (1 < TVar4 - ARRAY) goto LAB_0012f279;
      }
      iVar8 = this->_level + 1;
      this->_level = iVar8;
      String::repeat((String *)local_78,'\t',iVar8);
      String::operator=(&this->_indent,(String *)local_78);
      String::~String((String *)local_78);
      String::operator+=(&this->_out,'\n');
      String::operator+=(&this->_out,&this->_indent);
      iVar8 = 1;
    }
LAB_0012f510:
    local_50 = &this->_sep2;
    pSVar1 = &this->_indent;
    while( true ) {
      iVar5 = Var::length(v);
      if (iVar5 <= (int)i_00) break;
      if (i_00 != 0) {
        b = &this->_sep1;
        if (((char)iVar8 != '\0') && ((i_00 & 0xf) == 0 || (uVar9 & 1) != 0)) {
          String::operator+=(&this->_out,local_50);
          String::operator+=(&this->_out,'\n');
          b = pSVar1;
        }
        String::operator+=(&this->_out,b);
      }
      pVVar6 = Var::operator[](v,i_00);
      _encode(this,pVVar6);
      i_00 = i_00 + 1;
    }
    if ((char)iVar8 != '\0') {
      iVar8 = this->_level + -1;
      this->_level = iVar8;
      String::repeat((String *)local_78,'\t',iVar8);
      String::operator=(pSVar1,(String *)local_78);
      String::~String((String *)local_78);
      String::operator+=(&this->_out,'\n');
      String::operator+=(&this->_out,pSVar1);
    }
    end_array(this);
    break;
  case DIC:
    if (this->_json == false) {
      String::String((String *)local_78,"$type");
      pVVar6 = Var::getp(v,(String *)local_78);
      String::~String((String *)local_78);
      if (pVVar6 == (Var *)0x0) {
        _class = "";
      }
      else {
        _class = Var::operator*(pVVar6);
      }
      begin_object(this,_class);
    }
    else {
      begin_object(this,"");
      pVVar6 = (Var *)0x0;
    }
    if (this->_pretty == true) {
      iVar8 = this->_level + 1;
      this->_level = iVar8;
      String::repeat((String *)local_78,'\t',iVar8);
      String::operator=(&this->_indent,(String *)local_78);
      String::~String((String *)local_78);
    }
    local_58 = 0;
    if (v->_type == DIC) {
      local_78._16_8_ = &v->field_1;
      local_60 = 0;
    }
    local_78._0_4_ = 1;
    pSVar1 = &this->_indent;
    iVar8 = 0;
    local_78._8_8_ = v;
    while (bVar2 = Var::Enumerator::operator_cast_to_bool((Enumerator *)(local_78 + 8)),
          bVar2 && local_78._0_4_ != 0) {
      pVVar7 = Var::Enumerator::operator*((Enumerator *)(local_78 + 8));
      for (; 0 < (int)local_78._0_4_; local_78._0_4_ = local_78._0_4_ - 2) {
        Var::Enumerator::operator~(&local_48,(Enumerator *)(local_78 + 8));
        for (; local_78._0_4_ != 0; local_78._0_4_ = local_78._0_4_ - 1) {
          if ((pVVar7->_type != NONE) && (pVVar7 != pVVar6 || (this->_json & 1U) != 0)) {
            if (0 < iVar8) {
              String::operator+=(&this->_out,&this->_sep2);
            }
            if (this->_pretty == true) {
              String::operator+=(&this->_out,'\n');
              String::operator+=(&this->_out,pSVar1);
            }
            new_property(this,&local_48);
            _encode(this,pVVar7);
            iVar8 = iVar8 + 1;
          }
        }
        String::~String(&local_48);
      }
      local_58 = local_58 + 1;
      if (*(int *)local_78._8_8_ == 10) {
        local_60 = local_60 + 1;
      }
      local_78._0_4_ = ~local_78._0_4_;
    }
    if (this->_pretty != false) {
      iVar8 = this->_level + -1;
      this->_level = iVar8;
      String::repeat((String *)local_78,'\t',iVar8);
      String::operator=(pSVar1,(String *)local_78);
      String::~String((String *)local_78);
      String::operator+=(&this->_out,'\n');
      String::operator+=(&this->_out,pSVar1);
    }
    end_object(this);
  }
  if (16000 < (this->_out)._len) {
    (*this->_sink->_vptr_XdlSink[2])(this->_sink,this);
  }
  return;
}

Assistant:

void XdlEncoder::_encode(const Var& v)
{
	switch(v._type)
	{
	case Var::FLOAT:
		new_number((float)v._d);
		break;
	case Var::NUMBER:
		new_number(v._d);
		break;
	case Var::INT:
		new_number(v._i);
		break;
	case Var::STRING:
		new_string(v._s->data());
		break;
	case Var::SSTRING:
		new_string(v._ss);
		break;
	case Var::BOOL:
		new_bool(v._b);
		break;
	case Var::ARRAY: {
		begin_array();
		int n = v.length();
		const Var& v0 = n>0? v[0] : v;
		bool multi = (_pretty && (n > 10 || (n>0  && (v0.is(Var::ARRAY) || v0.is(Var::OBJ)))));
		if (_pretty && !multi && v0.is(Var::STRING))
		{
			for (int i = 0, m = 0; i < n; i++)
				if ((m += v[i].length()) > 100)
				{
					multi = true;
					break;
				}
		}
		bool big = false;
		if(multi)
		{
			big = n > 0 && (v0.is(Var::ARRAY) || v0.is(Var::DIC) || v0.is(Var::STRING));
			_indent = String::repeat(INDENT_CHAR, ++_level);
			_out << '\n' << _indent;
		}
		for(int i=0; i<v.length(); i++)
		{
			if(i>0) {
				if (multi && (big || (i % 16) == 0))
					_out << _sep2 << '\n' << _indent;
				else
					_out << _sep1;
			}
			_encode(v[i]);
		}
		if(multi) {
			_indent = String::repeat(INDENT_CHAR, --_level);
			_out << '\n' << _indent;
		}
		end_array();
		break;
		}
	case Var::OBJ: {
		const Var* cname = 0;
		if (!_json)
		{
			cname = v.getp(ASL_XDLCLASS);
			begin_object(cname ? **cname : "");
		}
		else
			begin_object("");
		int k = 0;
		if (_pretty)
			_indent = String::repeat(INDENT_CHAR, ++_level);

		foreach2(String& name, Var& value, v)
		{
			if(value.ok() && (_json || &value != cname))
			{
				if (k++ > 0)
					_out << _sep2;
				if (_pretty)
					_out << '\n' << _indent;

				new_property(name);
				_encode(value);
			}
		}
		if(_pretty) {
			_indent = String::repeat(INDENT_CHAR, --_level);
			_out << '\n' << _indent;
		}
		end_object();
		}
		break;
	case Var::NUL:
		_out << "null";
		break;
	case Var::NONE:
		_out << "null";
		break;
	}

	if (_out.length() > 16000)
		_sink->write(_out);
}